

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.c
# Opt level: O2

int query_int(char *prompt,int minimum,int maximum)

{
  int iVar1;
  char *pcVar2;
  int res;
  int local_440;
  int local_43c;
  char str [1024];
  
  local_440 = minimum;
  local_43c = maximum;
  while( true ) {
    while( true ) {
      res = 0;
      printf("%s",prompt);
      pcVar2 = fgets(str,0x400,_stdin);
      if (pcVar2 == (char *)0x0) {
        exit(1);
      }
      iVar1 = __isoc99_sscanf(str,"%d",&res);
      if (iVar1 == 1) break;
      puts("Invalid number entered!");
      __isoc99_scanf("%*[^\n]");
    }
    if (local_440 <= res && res <= local_43c) break;
    puts("Invalid number entered!");
  }
  return res;
}

Assistant:

int query_int(const char* prompt, const int minimum, const int maximum) {
  while (true) {
    char str[1024];
    int res = 0;

    printf("%s", prompt);

    if (!fgets(str, 1024, stdin)) exit(1);

    const int scanf_res = sscanf(str, "%d", &res);

    if (scanf_res != 1) {
      printf("Invalid number entered!\n");
      scanf("%*[^\n]");
    } else if (res < minimum || res > maximum) {
      printf("Invalid number entered!\n");
    } else {
      return res;
    }
  }
}